

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::TryGenerateFastBrOrCmTypeOf
          (Lowerer *this,Instr *instr,Instr **prev,bool isNeqOp,bool *pfNoLower)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  byte bVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  StackSym *pSVar8;
  AddrOpnd *pAVar9;
  JITJavascriptString *pJVar10;
  IntConstOpnd *typeIdOpnd;
  Instr *this_00;
  BranchInstr *pBVar11;
  Opnd *pOVar12;
  RegOpnd *this_01;
  RegOpnd *this_02;
  RegOpnd *pRVar13;
  uint uVar14;
  IntConstType value;
  Lowerer *this_03;
  Opnd *pOVar15;
  RegOpnd *pRVar16;
  bool bVar17;
  bool bVar18;
  undefined1 local_78 [8];
  InternalString typeNameString;
  
  if (prev == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6172,"(prev)","prev");
    if (!bVar3) goto LAB_005db760;
    *puVar6 = 0;
  }
  uVar14 = instr->m_opcode - 0xc;
  if (((0x36 < uVar14) || ((0x70800000000303U >> ((ulong)uVar14 & 0x3f) & 1) == 0)) &&
     (3 < instr->m_opcode - 0x194)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x617e,
                       "(instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar3) goto LAB_005db760;
    *puVar6 = 0;
  }
  pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(instr);
  bVar3 = pIVar7 == (Instr *)0x0;
  if (bVar3) {
    bVar17 = false;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar17 = pIVar7->m_opcode == Ld_A;
    bVar18 = bVar17;
    while (bVar18) {
      OVar4 = IR::Opnd::GetKind(pIVar7->m_dst);
      if (OVar4 != OpndKindReg) goto LAB_005db515;
      pOVar15 = pIVar7->m_dst;
      OVar4 = IR::Opnd::GetKind(pOVar15);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) goto LAB_005db760;
        *puVar6 = 0;
      }
      if ((((ushort)pOVar15[1].m_valueType.field_0 & 8) == 0) || ((pIVar7->field_0x38 & 0x10) != 0))
      goto LAB_005db515;
      pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(pIVar7);
      bVar3 = pIVar7 == (Instr *)0x0;
      if (bVar3) break;
      bVar18 = pIVar7->m_opcode == Ld_A;
    }
  }
  OVar4 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar4 == OpndKindReg) {
    this_01 = (RegOpnd *)instr->m_src1;
    OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                          ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar18) goto LAB_005db760;
      *puVar6 = 0;
    }
  }
  else {
    this_01 = (RegOpnd *)0x0;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_src2);
  if (OVar4 == OpndKindReg) {
    this_02 = (RegOpnd *)instr->m_src2;
    OVar4 = IR::Opnd::GetKind((Opnd *)this_02);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                          ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar18) goto LAB_005db760;
      *puVar6 = 0;
    }
  }
  else {
    this_02 = (RegOpnd *)0x0;
  }
  if ((!bVar3) && (pIVar7->m_opcode == Typeof)) {
    OVar4 = IR::Opnd::GetKind(pIVar7->m_dst);
    pRVar13 = (RegOpnd *)(ulong)OVar4;
    if (OVar4 == OpndKindReg) {
      pOVar15 = pIVar7->m_dst;
      OVar4 = IR::Opnd::GetKind(pOVar15);
      pRVar13 = (RegOpnd *)(ulong)OVar4;
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        pRVar13 = (RegOpnd *)(ulong)bVar3;
        if (!bVar3) goto LAB_005db760;
        *puVar6 = 0;
      }
    }
    else {
      pOVar15 = (Opnd *)0x0;
    }
    bVar3 = true;
    if (((((this_02 != (RegOpnd *)0x0) && (this_01 != (RegOpnd *)0x0)) && (pOVar15 != (Opnd *)0x0))
        && ((pRVar13 = this_01, pRVar16 = this_02,
            typeNameString.m_content.ptr = (char16_t *)pOVar15,
            this_01->m_sym == (StackSym *)pOVar15[1]._vptr_Opnd ||
            (pRVar13 = this_02, pRVar16 = this_01,
            this_02->m_sym == (StackSym *)pOVar15[1]._vptr_Opnd)))) &&
       ((pRVar13->field_0x18 & 1) != 0)) {
      if ((~*(uint *)&pRVar16->m_sym->field_0x18 & 0x401) == 0) {
        OVar4 = IR::Opnd::GetKind(((pRVar16->m_sym->field_5).m_instrDef)->m_src1);
        if (OVar4 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x61c1,"(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd())",
                             "idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd()");
          if (!bVar3) goto LAB_005db760;
          *puVar6 = 0;
        }
        pAVar9 = IR::Opnd::AsAddrOpnd(((pRVar16->m_sym->field_5).m_instrDef)->m_src1);
        pJVar10 = JITJavascriptString::FromVar(pAVar9->m_localAddress);
        value = 0;
        Js::InternalString::InternalString
                  ((InternalString *)local_78,pJVar10->m_pszValue,pJVar10->m_charLength,'\0');
        bVar3 = Js::InternalStringComparer::Equals
                          ((InternalString *)local_78,
                           (InternalString *)Js::Type::UndefinedTypeNameString);
        if (bVar3) {
LAB_005db3ca:
          typeIdOpnd = IR::IntConstOpnd::New(value,TyInt32,instr->m_func,false);
          if (bVar17) {
            pOVar15 = pIVar7->m_src1;
            this_00 = pIVar7;
            while( true ) {
              this_00 = IR::Instr::GetNextRealInstr(this_00);
              if (this_00 == instr) break;
              bVar3 = IR::Opnd::IsEqual(this_00->m_dst,(Opnd *)typeNameString.m_content.ptr);
              if ((bVar3) || (bVar3 = IR::Opnd::IsEqual(this_00->m_dst,pOVar15), bVar3))
              goto LAB_005db674;
            }
            IR::Instr::Unlink(pIVar7);
            IR::Instr::InsertBefore(instr,pIVar7);
LAB_005db674:
            if (this_00 != instr) goto LAB_005db757;
          }
          pOVar15 = pIVar7->m_src1;
          OVar4 = IR::Opnd::GetKind(pOVar15);
          if (OVar4 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x61f7,"(objectOpnd->IsRegOpnd())","objectOpnd->IsRegOpnd()");
            if (!bVar3) {
LAB_005db760:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
          }
          *prev = pIVar7->m_prev;
          *pfNoLower = false;
          IVar1 = instr->m_kind;
          pRVar13 = IR::Opnd::AsRegOpnd(pOVar15);
          if (IVar1 == InstrKindBranch) {
            GenerateFastBrTypeOf(this,instr,pRVar13,typeIdOpnd,pIVar7,pfNoLower,isNeqOp);
          }
          else {
            GenerateFastCmTypeOf(this,instr,pRVar13,typeIdOpnd,pIVar7,pfNoLower,isNeqOp);
          }
          pRVar13 = (RegOpnd *)&DAT_00000001;
        }
        else {
          bVar3 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_78,
                             (InternalString *)Js::Type::ObjectTypeNameString);
          value = 0x1c;
          if (bVar3) goto LAB_005db3ca;
          bVar3 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_78,
                             (InternalString *)Js::Type::BooleanTypeNameString);
          value = 2;
          if (bVar3) goto LAB_005db3ca;
          bVar3 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_78,
                             (InternalString *)Js::Type::NumberTypeNameString);
          value = 4;
          if (bVar3) goto LAB_005db3ca;
          bVar3 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_78,
                             (InternalString *)Js::Type::StringTypeNameString);
          value = 7;
          if (bVar3) goto LAB_005db3ca;
          bVar3 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_78,
                             (InternalString *)Js::Type::FunctionTypeNameString);
          value = 0x1b;
          if (bVar3) goto LAB_005db3ca;
LAB_005db757:
          pRVar13 = (RegOpnd *)0x0;
        }
        bVar3 = false;
      }
      else {
        bVar3 = false;
        pRVar13 = (RegOpnd *)0x0;
      }
    }
    bVar5 = (byte)pRVar13;
    if (!bVar3) goto LAB_005db517;
  }
  if (this_01 == (RegOpnd *)0x0) {
LAB_005db515:
    bVar5 = 0;
  }
  else {
    pSVar8 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
    bVar5 = 0;
    if (((this_02 == (RegOpnd *)0x0) || ((*(uint *)&pSVar8->field_0x18 & 1) == 0)) ||
       ((pSVar8->field_5).m_instrDef == (Instr *)0x0)) goto LAB_005db517;
    pSVar8 = IR::Opnd::GetStackSym(&this_02->super_Opnd);
    bVar5 = 0;
    if (((pSVar8->field_0x18 & 1) == 0) || ((pSVar8->field_5).m_instrDef == (Instr *)0x0))
    goto LAB_005db517;
    pSVar8 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
    if ((pSVar8->field_0x18 & 1) == 0) {
      pIVar7 = (Instr *)0x0;
    }
    else {
      pIVar7 = (pSVar8->field_5).m_instrDef;
    }
    if (pIVar7->m_opcode == Typeof) {
      pSVar8 = IR::Opnd::GetStackSym(&this_02->super_Opnd);
      if ((pSVar8->field_0x18 & 1) == 0) {
        pIVar7 = (Instr *)0x0;
      }
      else {
        pIVar7 = (pSVar8->field_5).m_instrDef;
      }
      if (pIVar7->m_opcode != Typeof) {
        pSVar8 = IR::Opnd::GetStackSym(&this_02->super_Opnd);
        bVar3 = StackSym::GetIsStrConst(pSVar8);
        if (!bVar3) goto LAB_005db47d;
      }
    }
    else {
LAB_005db47d:
      pSVar8 = IR::Opnd::GetStackSym(&this_02->super_Opnd);
      bVar5 = 0;
      if ((pSVar8->field_0x18 & 1) == 0) {
        pIVar7 = (Instr *)0x0;
      }
      else {
        pIVar7 = (pSVar8->field_5).m_instrDef;
      }
      if (pIVar7->m_opcode != Typeof) goto LAB_005db517;
      pSVar8 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
      if ((pSVar8->field_0x18 & 1) == 0) {
        pIVar7 = (Instr *)0x0;
      }
      else {
        pIVar7 = (pSVar8->field_5).m_instrDef;
      }
      if (pIVar7->m_opcode != Typeof) {
        pSVar8 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
        bVar3 = StackSym::GetIsStrConst(pSVar8);
        if (!bVar3) goto LAB_005db515;
      }
    }
    *pfNoLower = true;
    if (instr->m_kind == InstrKindBranch) {
      this_03 = (Lowerer *)instr;
      pBVar11 = IR::Instr::AsBranchInstr(instr);
      InsertCompareBranch(this_03,&this_01->super_Opnd,&this_02->super_Opnd,isNeqOp | BrEq_A,false,
                          pBVar11->m_branchTarget,instr,false);
    }
    else {
      bVar3 = IR::Opnd::IsEqual(&this_01->super_Opnd,&this_02->super_Opnd);
      pOVar15 = instr->m_dst;
      if (bVar3) {
        pOVar12 = LoadLibraryValueOpnd(this,instr,isNeqOp + ValueTrue);
        InsertMove(pOVar15,pOVar12,instr,true);
      }
      else {
        bVar3 = IR::Opnd::IsEqual(pOVar15,&this_01->super_Opnd);
        if (bVar3) {
          pIVar7 = IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,(StackSym *)0x0);
          pIVar7 = LowererMD::ChangeToAssign(pIVar7);
          this_01 = IR::Opnd::AsRegOpnd(pIVar7->m_dst);
        }
        bVar3 = IR::Opnd::IsEqual(instr->m_dst,&this_02->super_Opnd);
        if (bVar3) {
          pIVar7 = IR::Instr::HoistSrc2(instr,Ld_A,RegNOREG,(StackSym *)0x0);
          pIVar7 = LowererMD::ChangeToAssign(pIVar7);
          this_02 = IR::Opnd::AsRegOpnd(pIVar7->m_dst);
        }
        pOVar15 = instr->m_dst;
        pOVar12 = LoadLibraryValueOpnd(this,instr,ValueTrue);
        InsertMove(pOVar15,pOVar12,instr,true);
        InsertCompare(&this_01->super_Opnd,&this_02->super_Opnd,instr);
        pOVar15 = instr->m_dst;
        pOVar12 = LoadLibraryValueOpnd(this,instr,ValueFalse);
        LowererMD::InsertCmovCC
                  ((ushort)!isNeqOp + (ushort)!isNeqOp * 4 + CMOVE,pOVar15,pOVar12,instr,false);
      }
    }
    IR::Instr::Remove(instr);
    bVar5 = 1;
  }
LAB_005db517:
  return (bool)(bVar5 & 1);
}

Assistant:

bool
Lowerer::TryGenerateFastBrOrCmTypeOf(IR::Instr *instr, IR::Instr **prev, bool isNeqOp, bool *pfNoLower)
{
    Assert(prev);
    Assert(instr->m_opcode == Js::OpCode::BrSrEq_A     ||
           instr->m_opcode == Js::OpCode::BrSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrSrNotEq_A  ||
           instr->m_opcode == Js::OpCode::BrSrNotNeq_A ||
           instr->m_opcode == Js::OpCode::CmSrEq_A     ||
           instr->m_opcode == Js::OpCode::CmSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrEq_A       ||
           instr->m_opcode == Js::OpCode::BrNeq_A      ||
           instr->m_opcode == Js::OpCode::BrNotEq_A    ||
           instr->m_opcode == Js::OpCode::BrNotNeq_A   ||
           instr->m_opcode == Js::OpCode::CmEq_A       ||
           instr->m_opcode == Js::OpCode::CmNeq_A);

    //
    // instr         - (Br/Cm)(Sr)(N(ot))eq_A
    // instr->m_prev - typeOf
    //
    IR::Instr *instrLd = instr->GetPrevRealInstrOrLabel();
    bool skippedLoads = false;
    //Skip intermediate Ld_A which might be inserted by flow graph peeps
    while (instrLd && instrLd->m_opcode == Js::OpCode::Ld_A )
    {
        if (!(instrLd->GetDst()->IsRegOpnd() && instrLd->GetDst()->AsRegOpnd()->m_fgPeepTmp))
        {
            return false;
        }
        if (instrLd->HasBailOutInfo())
        {
            return false;
        }
        instrLd = instrLd->GetPrevRealInstrOrLabel();
        skippedLoads = true;
    }

    IR::Instr *typeOf = instrLd;

    IR::RegOpnd *instrSrc1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *instrSrc2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;
    if (typeOf && (typeOf->m_opcode == Js::OpCode::Typeof))
    {
        IR::RegOpnd *typeOfDst = typeOf->GetDst()->IsRegOpnd() ? typeOf->GetDst()->AsRegOpnd() : nullptr;

        if (typeOfDst && instrSrc1 && instrSrc2)
        {
            do
            {
                IR::RegOpnd *typeOpnd = nullptr;
                IR::RegOpnd *idOpnd = nullptr;
                if (instrSrc1->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc1;
                    idOpnd = instrSrc2;
                }
                else if (instrSrc2->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc2;
                    idOpnd = instrSrc1;
                }
                else
                {
                    // Neither source turned out to be the typeOpnd
                    break;
                }

                if (!typeOpnd->m_isTempLastUse)
                {
                    break;
                }

                if (!(idOpnd->m_sym->m_isSingleDef && idOpnd->m_sym->m_isStrConst))
                {
                    return false;
                }

                // The second argument to [Cm|Br]TypeOf is the typeid.
                IR::IntConstOpnd *typeIdOpnd = nullptr;

                Assert(idOpnd->m_sym->m_isSingleDef);
                Assert(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd());

                // We can't optimize non-javascript type strings.
                JITJavascriptString *typeNameJsString = JITJavascriptString::FromVar(idOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_localAddress);
                const char16        *typeName = typeNameJsString->GetString();

                Js::InternalString typeNameString(typeName, typeNameJsString->GetLength());
                if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::UndefinedTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Undefined, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::ObjectTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Object, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::BooleanTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Boolean, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::NumberTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::StringTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_String, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::FunctionTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, instr->m_func);
                }
                else
                {
                    return false;
                }

                if (skippedLoads)
                {
                    //validate none of dst of Ld_A overlaps with typeof src or dst
                    IR::Opnd* typeOfSrc = typeOf->GetSrc1();
                    instrLd = typeOf->GetNextRealInstr();
                    while (instrLd != instr)
                    {
                        if (instrLd->GetDst()->IsEqual(typeOfDst) || instrLd->GetDst()->IsEqual(typeOfSrc))
                        {
                            return false;
                        }
                        instrLd = instrLd->GetNextRealInstr();
                    }
                    typeOf->Unlink();
                    instr->InsertBefore(typeOf);
                }
                // The first argument to [Cm|Br]TypeOf is the first arg to the TypeOf instruction.
                IR::Opnd *objectOpnd = typeOf->GetSrc1();
                Assert(objectOpnd->IsRegOpnd());

                // Now emit this instruction and remove the ldstr and typeOf.
                *prev = typeOf->m_prev;
                *pfNoLower = false;
                if (instr->IsBranchInstr())
                {
                    GenerateFastBrTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }
                else
                {
                    GenerateFastCmTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }

                return true;
            } while (false);
        }
    }

    if (instrSrc1 && instrSrc1->GetStackSym()->IsSingleDef() && instrSrc2 && instrSrc2->GetStackSym()->IsSingleDef() &&
        (
            ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc2->GetStackSym()->GetIsStrConst()))
            ||
            ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc1->GetStackSym()->GetIsStrConst()))
            )
        )
    {
        *pfNoLower = true;
        if (instr->IsBranchInstr())
        {
            InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, instr->AsBranchInstr()->GetTarget(), instr);
            instr->Remove();
        }
        else
        {
            if (instrSrc1->IsEqual(instrSrc2))
            {
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, isNeqOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue), instr);
            }
            else
            {
                // t1 = typeof o1
                // t2 = typeof o2
                // dst = t1 == t2

                // MOV dst, true
                // CMP t1, t2

                // x86, amd64
                // CMOVNE dst, false

                // arm
                // BEQ $done
                // MOV dst, false
                // $done

                if (instr->GetDst()->IsEqual(instrSrc1))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
                    instrSrc1 = hoistInstr->GetDst()->AsRegOpnd();
                }
                if (instr->GetDst()->IsEqual(instrSrc2))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc2(Js::OpCode::Ld_A));
                    instrSrc2 = hoistInstr->GetDst()->AsRegOpnd();
                }

                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);

#if defined(_M_ARM32_OR_ARM64)
                IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
                InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, doneLabel, instr);
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
                instr->InsertBefore(doneLabel);
#else
                InsertCompare(instrSrc1, instrSrc2, instr);
                LowererMD::InsertCmovCC(isNeqOp ? Js::OpCode::CMOVE : Js::OpCode::CMOVNE, instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
#endif
            }
            instr->Remove();
        }
        return true;
    }

    return false;
}